

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  int local_4c;
  int local_48;
  int local_44;
  UNITY_INT32 n;
  int digits;
  int decimals;
  int exponent;
  UNITY_DOUBLE number;
  UNITY_DOUBLE input_number_local;
  char buf [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((input_number < 0.0) ||
     (((_decimals = input_number, input_number == 0.0 && (!NAN(input_number))) &&
      (1.0 / input_number < 0.0)))) {
    putchar(0x2d);
    _decimals = -input_number;
  }
  if ((_decimals != 0.0) || (NAN(_decimals))) {
    if (NAN(_decimals)) {
      UnityPrint("nan");
    }
    else {
      iVar3 = 1;
      if ((long)_decimals < 0) {
        iVar3 = -1;
      }
      iVar2 = 0;
      if (ABS(_decimals) == INFINITY) {
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        digits = 0;
        for (; _decimals < 0.10000000149011612; _decimals = _decimals * 1000000.0) {
          digits = digits + -6;
        }
        for (; _decimals < 100000.0; _decimals = _decimals * 10.0) {
          digits = digits + -1;
        }
        for (; 999999995904.0 < _decimals; _decimals = _decimals / 1000000.0) {
          digits = digits + 6;
        }
        for (; 1000000.0 < _decimals; _decimals = _decimals / 10.0) {
          digits = digits + 1;
        }
        local_48 = ((int)(_decimals + _decimals) + 1) / 2;
        if (999999 < local_48) {
          local_48 = 100000;
          digits = digits + 1;
        }
        if ((digits < 1) && (-10 < digits)) {
          local_4c = -digits;
        }
        else {
          local_4c = 5;
        }
        digits = local_4c + digits;
        for (n = local_4c; 0 < n && local_48 % 10 == 0; n = n + -1) {
          local_48 = local_48 / 10;
        }
        local_44 = 0;
        for (; local_48 != 0 || local_44 < n + 1; local_48 = local_48 / 10) {
          buf[(long)local_44 + -8] = (char)(local_48 % 10) + '0';
          local_44 = local_44 + 1;
        }
        while (0 < local_44) {
          if (local_44 == n) {
            putchar(0x2e);
          }
          local_44 = local_44 + -1;
          putchar((int)buf[(long)local_44 + -8]);
        }
        if (digits != 0) {
          putchar(0x65);
          if (digits < 0) {
            putchar(0x2d);
            digits = -digits;
          }
          else {
            putchar(0x2b);
          }
          local_44 = 0;
          for (; digits != 0 || local_44 < 2; digits = digits / 10) {
            buf[(long)local_44 + -8] = (char)(digits % 10) + '0';
            local_44 = local_44 + 1;
          }
          while (0 < local_44) {
            local_44 = local_44 + -1;
            putchar((int)buf[(long)local_44 + -8]);
          }
        }
      }
      else {
        UnityPrint("inf");
      }
    }
  }
  else {
    UnityPrint("0");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number = input_number;

    /* print minus sign (including for negative zero) */
    if (number < (double)0.0f || (number == (double)0.0f && (double)1.0f / number < (double)0.0f))
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == (double)0.0f) UnityPrint("0");
    else if (isnan(number)) UnityPrint("nan");
    else if (isinf(number)) UnityPrint("inf");
    else
    {
        int exponent = 0;
        int decimals, digits;
        UNITY_INT32 n;
        char buf[16];

        /* scale up or down by powers of 10 */
        while (number < (double)(100000.0f / 1e6f))  { number *= (double)1e6f; exponent -= 6; }
        while (number < (double)100000.0f)         { number *= (double)10.0f; exponent--; }
        while (number > (double)(1000000.0f * 1e6f)) { number /= (double)1e6f; exponent += 6; }
        while (number > (double)1000000.0f)        { number /= (double)10.0f; exponent++; }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;
        if (n > 999999)
        {
            n = 100000;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = (exponent <= 0 && exponent >= -9) ? -exponent : 5;
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while (decimals > 0 && n % 10 == 0)
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while (n != 0 || digits < decimals + 1)
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if(digits == decimals) UNITY_OUTPUT_CHAR('.');
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if(exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while (exponent != 0 || digits < 2)
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}